

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

parse_return
msgpack::v2::detail::parse_imp<msgpack::v2::detail::create_object_visitor>
          (char *data,size_t len,size_t *off,create_object_visitor *v)

{
  ulong *in_RDX;
  ulong in_RSI;
  parse_return ret;
  parse_helper<msgpack::v2::detail::create_object_visitor> h;
  size_t noff;
  create_object_visitor *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *data_00;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  create_object_visitor *in_stack_ffffffffffffff80;
  char local_70 [64];
  ulong local_30;
  ulong *local_20;
  ulong local_18;
  parse_return local_4;
  
  local_30 = *in_RDX;
  if (local_30 < in_RSI) {
    data_00 = local_70;
    local_20 = in_RDX;
    local_18 = in_RSI;
    parse_helper<msgpack::v2::detail::create_object_visitor>::parse_helper
              ((parse_helper<msgpack::v2::detail::create_object_visitor> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    local_4 = parse_helper<msgpack::v2::detail::create_object_visitor>::execute
                        ((parse_helper<msgpack::v2::detail::create_object_visitor> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),data_00,
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (size_t *)in_stack_ffffffffffffff58);
    if (local_4 == PARSE_CONTINUE) {
      *local_20 = local_30;
      create_object_visitor::insufficient_bytes
                (in_stack_ffffffffffffff80,
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (ulong)in_stack_ffffffffffffff70);
    }
    else if ((local_4 == PARSE_SUCCESS) && (*local_20 = local_30, local_30 < local_18)) {
      local_4 = PARSE_EXTRA_BYTES;
    }
    parse_helper<msgpack::v2::detail::create_object_visitor>::~parse_helper
              ((parse_helper<msgpack::v2::detail::create_object_visitor> *)0x26b9af);
  }
  else {
    create_object_visitor::insufficient_bytes
              (in_stack_ffffffffffffff80,
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_4 = PARSE_CONTINUE;
  }
  return local_4;
}

Assistant:

inline parse_return
parse_imp(const char* data, size_t len, size_t& off, Visitor& v) {
    std::size_t noff = off;

    if(len <= noff) {
        // FIXME
        v.insufficient_bytes(noff, noff);
        return PARSE_CONTINUE;
    }
    detail::parse_helper<Visitor> h(v);
    parse_return ret = h.execute(data, len, noff);
    switch (ret) {
    case PARSE_CONTINUE:
        off = noff;
        v.insufficient_bytes(noff - 1, noff);
        return ret;
    case PARSE_SUCCESS:
        off = noff;
        if(noff < len) {
            return PARSE_EXTRA_BYTES;
        }
        return ret;
    default:
        return ret;
    }
}